

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::getDefaultUniformName_abi_cxx11_
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,int idx)

{
  ostream *this_00;
  undefined1 local_198 [8];
  StringStream s;
  int idx_local;
  ShaderStorageBufferLayoutBindingCase *this_local;
  
  s.super_ostringstream._372_4_ = idx;
  StringStream::StringStream((StringStream *)local_198);
  this_00 = std::operator<<((ostream *)local_198,"buffer");
  std::ostream::operator<<(this_00,s.super_ostringstream._372_4_);
  std::__cxx11::ostringstream::str();
  StringStream::~StringStream((StringStream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

String getDefaultUniformName(int idx = 0)
	{
		StringStream s;

		s << "buffer" << idx;
		return s.str();
	}